

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cSparseBufferTests.cpp
# Opt level: O0

void __thiscall
gl4cts::PixelPackBufferStorageTestCase::PixelPackBufferStorageTestCase
          (PixelPackBufferStorageTestCase *this,Functions *gl,TestContext *testContext,
          GLint page_size)

{
  GLint page_size_local;
  TestContext *testContext_local;
  Functions *gl_local;
  PixelPackBufferStorageTestCase *this_local;
  
  BufferStorageTestCase::BufferStorageTestCase(&this->super_BufferStorageTestCase);
  (this->super_BufferStorageTestCase)._vptr_BufferStorageTestCase =
       (_func_int **)&PTR__PixelPackBufferStorageTestCase_0323ca80;
  this->m_color_rb = 0;
  this->m_color_rb_height = 0x400;
  this->m_color_rb_width = 0x400;
  this->m_fbo = 0;
  this->m_gl = gl;
  this->m_helper_bo = 0;
  this->m_page_size = page_size;
  this->m_po = 0;
  this->m_ref_data_ptr = (uchar *)0x0;
  this->m_ref_data_size = 0;
  this->m_sparse_bo = 0;
  this->m_sparse_bo_size = 0;
  this->m_sparse_bo_size_rounded = 0;
  this->m_testCtx = testContext;
  this->m_vao = 0;
  this->m_ref_data_size = this->m_color_rb_width * this->m_color_rb_height * 4;
  return;
}

Assistant:

PixelPackBufferStorageTestCase::PixelPackBufferStorageTestCase(const glw::Functions& gl, tcu::TestContext& testContext,
															   glw::GLint page_size)
	: m_color_rb(0)
	, m_color_rb_height(1024)
	, m_color_rb_width(1024)
	, m_fbo(0)
	, m_gl(gl)
	, m_helper_bo(0)
	, m_page_size(page_size)
	, m_po(0)
	, m_ref_data_ptr(DE_NULL)
	, m_ref_data_size(0)
	, m_sparse_bo(0)
	, m_sparse_bo_size(0)
	, m_sparse_bo_size_rounded(0)
	, m_testCtx(testContext)
	, m_vao(0)
{
	m_ref_data_size = m_color_rb_width * m_color_rb_height * 4; /* rgba */
}